

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseConversion.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
OpenMD::toUpperCopy<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,OpenMD *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cont,
          locale *param_2)

{
  locale local_20 [8];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)this,*(long *)(this + 8) + *(long *)this);
  std::locale::locale(local_20);
  toUpper<std::__cxx11::string>(__return_storage_ptr__,local_20);
  std::locale::~locale(local_20);
  return __return_storage_ptr__;
}

Assistant:

Container toUpperCopy(const Container& cont,
                        const std::locale& = std::locale()) {
    Container result {cont};
    toUpper(result);

    return result;
  }